

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timMan.c
# Opt level: O2

void Tim_ManPrintBoxCopy(Tim_Man_t *p)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  void *pvVar5;
  int i;
  Vec_Ptr_t *p_00;
  ulong uVar6;
  
  if (p != (Tim_Man_t *)0x0) {
    puts("TIMING MANAGER:");
    uVar2 = Tim_ManPiNum(p);
    uVar1 = p->nCis;
    uVar3 = Tim_ManPoNum(p);
    if (p->vBoxes == (Vec_Ptr_t *)0x0) {
      uVar6 = 0;
    }
    else {
      uVar6 = (ulong)(uint)p->vBoxes->nSize;
    }
    printf("PI = %d. CI = %d. PO = %d. CO = %d. Box = %d.\n",(ulong)uVar2,(ulong)uVar1,(ulong)uVar3,
           (ulong)(uint)p->nCos,uVar6);
    p_00 = p->vBoxes;
    if ((p_00 != (Vec_Ptr_t *)0x0) && (iVar4 = p_00->nSize, 0 < iVar4)) {
      for (i = 0; i < iVar4; i = i + 1) {
        pvVar5 = Vec_PtrEntry(p_00,i);
        printf("%d ",(ulong)*(uint *)((long)pvVar5 + 0x14));
        p_00 = p->vBoxes;
        iVar4 = p_00->nSize;
      }
    }
    putchar(10);
    return;
  }
  return;
}

Assistant:

void Tim_ManPrintBoxCopy( Tim_Man_t * p )
{
    Tim_Box_t * pBox;
    int i;
    if ( p == NULL )
        return;
    printf( "TIMING MANAGER:\n" );
    printf( "PI = %d. CI = %d. PO = %d. CO = %d. Box = %d.\n", 
        Tim_ManPiNum(p), Tim_ManCiNum(p), Tim_ManPoNum(p), Tim_ManCoNum(p), Tim_ManBoxNum(p) );

    if ( Tim_ManBoxNum(p) > 0 )
    Tim_ManForEachBox( p, pBox, i )
        printf( "%d ", pBox->iCopy );
    printf( "\n" );
}